

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_countBackwardsMatch(BYTE *pIn,BYTE *pAnchor,BYTE *pMatch,BYTE *pBase)

{
  bool bVar1;
  size_t local_30;
  size_t matchLength;
  BYTE *pBase_local;
  BYTE *pMatch_local;
  BYTE *pAnchor_local;
  BYTE *pIn_local;
  
  local_30 = 0;
  pBase_local = pMatch;
  pAnchor_local = pIn;
  while( true ) {
    bVar1 = false;
    if ((pAnchor < pAnchor_local) && (bVar1 = false, pBase < pBase_local)) {
      bVar1 = pAnchor_local[-1] == pBase_local[-1];
    }
    if (!bVar1) break;
    pAnchor_local = pAnchor_local + -1;
    pBase_local = pBase_local + -1;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

static size_t ZSTD_ldm_countBackwardsMatch(
            const BYTE* pIn, const BYTE* pAnchor,
            const BYTE* pMatch, const BYTE* pBase)
{
    size_t matchLength = 0;
    while (pIn > pAnchor && pMatch > pBase && pIn[-1] == pMatch[-1]) {
        pIn--;
        pMatch--;
        matchLength++;
    }
    return matchLength;
}